

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.h
# Opt level: O2

bool NextString<settings_tests::MergeTestingSetup::Action,3ul>
               (Action (*string) [3],Action min_char,Action max_char)

{
  Action AVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  Action AVar5;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = 0;
  do {
    lVar4 = lVar3;
    if (lVar4 == 0xc) break;
    AVar1 = *(Action *)((long)*string + lVar4);
    AVar5 = AVar1 + SET;
    if ((int)max_char <= (int)AVar1) {
      AVar5 = min_char;
    }
    if ((int)AVar1 < (int)min_char) {
      AVar5 = min_char;
    }
    *(Action *)((long)*string + lVar4) = AVar5;
    lVar3 = lVar4 + 4;
  } while (AVar1 == max_char);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return lVar4 != 0xc;
  }
  __stack_chk_fail();
}

Assistant:

bool NextString(CharType (&string)[StringLength], CharType min_char, CharType max_char)
{
    for (CharType& elem : string) {
        bool has_next = elem != max_char;
        elem = elem < min_char || elem >= max_char ? min_char : CharType(elem + 1);
        if (has_next) return true;
    }
    return false;
}